

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3OpenTempDatabase(Parse *pParse)

{
  long lVar1;
  int iVar2;
  int iVar3;
  Parse *in_RDI;
  long in_FS_OFFSET;
  int rc;
  sqlite3 *db;
  Btree *pBt;
  int in_stack_00000050;
  int in_stack_00000054;
  Btree **in_stack_00000058;
  sqlite3 *in_stack_00000060;
  char *in_stack_00000068;
  sqlite3_vfs *in_stack_00000070;
  undefined4 in_stack_ffffffffffffffd0;
  sqlite3 *psVar4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar4 = in_RDI->db;
  if ((psVar4->aDb[1].pBt == (Btree *)0x0) && (in_RDI->explain == '\0')) {
    iVar2 = sqlite3BtreeOpen(in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058
                             ,in_stack_00000054,in_stack_00000050);
    if (iVar2 != 0) {
      sqlite3ErrorMsg(in_RDI,"unable to open a temporary database file for storing temporary tables"
                     );
      in_RDI->rc = iVar2;
      iVar2 = 1;
      goto LAB_00158d1a;
    }
    psVar4->aDb[1].pBt = (Btree *)&DAT_aaaaaaaaaaaaaaaa;
    iVar3 = sqlite3BtreeSetPageSize
                      ((Btree *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                       (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)psVar4 >> 0x20));
    if (iVar3 == 7) {
      sqlite3OomFault((sqlite3 *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      iVar2 = 1;
      goto LAB_00158d1a;
    }
  }
  iVar2 = 0;
LAB_00158d1a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3OpenTempDatabase(Parse *pParse){
  sqlite3 *db = pParse->db;
  if( db->aDb[1].pBt==0 && !pParse->explain ){
    int rc;
    Btree *pBt;
    static const int flags =
          SQLITE_OPEN_READWRITE |
          SQLITE_OPEN_CREATE |
          SQLITE_OPEN_EXCLUSIVE |
          SQLITE_OPEN_DELETEONCLOSE |
          SQLITE_OPEN_TEMP_DB;

    rc = sqlite3BtreeOpen(db->pVfs, 0, db, &pBt, 0, flags);
    if( rc!=SQLITE_OK ){
      sqlite3ErrorMsg(pParse, "unable to open a temporary database "
        "file for storing temporary tables");
      pParse->rc = rc;
      return 1;
    }
    db->aDb[1].pBt = pBt;
    assert( db->aDb[1].pSchema );
    if( SQLITE_NOMEM==sqlite3BtreeSetPageSize(pBt, db->nextPagesize, 0, 0) ){
      sqlite3OomFault(db);
      return 1;
    }
  }
  return 0;
}